

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cpp
# Opt level: O0

void __thiscall
Renderer::Render(Renderer *this,vector<Obstacle,_std::allocator<Obstacle>_> *obst,
                vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_> *carObjects)

{
  bool bVar1;
  reference this_00;
  reference psVar2;
  element_type *peVar3;
  undefined1 local_88 [8];
  shared_ptr<Car> c;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_> *__range1_1;
  Obstacle *m;
  iterator __end1;
  iterator __begin1;
  vector<Obstacle,_std::allocator<Obstacle>_> *__range1;
  SDL_Rect texRect;
  SDL_Rect block;
  vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_> *carObjects_local;
  vector<Obstacle,_std::allocator<Obstacle>_> *obst_local;
  Renderer *this_local;
  
  SDL_SetRenderDrawColor(this->sdl_renderer,0x1e,0x1e,0x1e,0xff);
  SDL_RenderClear(this->sdl_renderer);
  __range1._0_4_ = 0;
  __range1._4_4_ = 0;
  texRect.x = 0x32;
  texRect.y = 0x32;
  SDL_RenderCopy(this->sdl_renderer,this->tex,0,&__range1);
  SDL_RenderPresent(this->sdl_renderer);
  if (this->endbmp == (SDL_Surface *)0x0) {
    std::operator<<((ostream *)&std::cout,"error rendering the flag");
  }
  SDL_SetRenderDrawColor(this->sdl_renderer,0xcc,0xff);
  __end1 = std::vector<Obstacle,_std::allocator<Obstacle>_>::begin(obst);
  m = (Obstacle *)std::vector<Obstacle,_std::allocator<Obstacle>_>::end(obst);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Obstacle_*,_std::vector<Obstacle,_std::allocator<Obstacle>_>_>
                                *)&m);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<Obstacle_*,_std::vector<Obstacle,_std::allocator<Obstacle>_>_>::
              operator*(&__end1);
    texRect.w = Obstacle::get_xpos(this_00);
    texRect.h = Obstacle::get_ypos(this_00);
    SDL_RenderFillRect(this->sdl_renderer,&texRect.w);
    __gnu_cxx::__normal_iterator<Obstacle_*,_std::vector<Obstacle,_std::allocator<Obstacle>_>_>::
    operator++(&__end1);
  }
  __end1_1 = std::vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_>::begin
                       (carObjects);
  c.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_>::end(carObjects);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<std::shared_ptr<Car>_*,_std::vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_>_>
                        *)&c.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if (!bVar1) break;
    psVar2 = __gnu_cxx::
             __normal_iterator<std::shared_ptr<Car>_*,_std::vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_>_>
             ::operator*(&__end1_1);
    std::shared_ptr<Car>::shared_ptr((shared_ptr<Car> *)local_88,psVar2);
    peVar3 = std::__shared_ptr_access<Car,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Car,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_88);
    texRect.w = Car::get_xpos(peVar3);
    peVar3 = std::__shared_ptr_access<Car,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Car,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_88);
    texRect.h = Car::get_ypos(peVar3);
    SDL_RenderCopy(this->sdl_renderer,this->texCar,0,&texRect.w);
    SDL_RenderPresent(this->sdl_renderer);
    std::shared_ptr<Car>::~shared_ptr((shared_ptr<Car> *)local_88);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<Car>_*,_std::vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_>_>
    ::operator++(&__end1_1);
  }
  SDL_RenderPresent(this->sdl_renderer);
  return;
}

Assistant:

void Renderer::Render( std::vector<Obstacle>& obst, std::vector<std::shared_ptr<Car>> carObjects) {
  SDL_Rect block;
  block.w = screen_width / grid_width;
  block.h = screen_height / grid_height;

  // Clear screen
  SDL_SetRenderDrawColor(sdl_renderer, 0x1E, 0x1E, 0x1E, 0xFF);
  SDL_RenderClear(sdl_renderer);

  SDL_Rect texRect;// hold the flag image
  texRect.x = 0;
  texRect.y = 0;
  texRect.w = 50;
  texRect.h = 50;

  //render the flag
  SDL_RenderCopy(sdl_renderer,tex,NULL, &texRect);
  SDL_RenderPresent(sdl_renderer);
  if(endbmp == NULL)std::cout<<"error rendering the flag";

 


  //render obstacles
  SDL_SetRenderDrawColor(sdl_renderer, 0xCC, 0xFF, 0xCC, 0xFF);
  for ( auto& m : obst){
    //std::cout << m <<std::endl;
    block.x = m.get_xpos();
    block.y = m.get_ypos();
    SDL_RenderFillRect(sdl_renderer, &block);
  }


  //render cars
  //SDL_SetRenderDrawColor(sdl_renderer, 0x99, 0x00, 0xFF, 0xFF);
  for ( auto c : carObjects){
    //std::cout << "car location =" <<c->get_xpos();
    block.x = c->get_xpos();
    block.y = c->get_ypos();
    //SDL_RenderFillRect(sdl_renderer, &block);

    block.h = 40;
    block.w = 40;
    SDL_RenderCopy(sdl_renderer,texCar,NULL, &block);
    SDL_RenderPresent(sdl_renderer);

  }


  // Update Screen
  SDL_RenderPresent(sdl_renderer);
}